

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParse3986RelativeRef(xmlURIPtr uri,char *str)

{
  char cVar1;
  int iVar2;
  char *pcStack_20;
  int ret;
  char *str_local;
  xmlURIPtr uri_local;
  
  str_local = (char *)uri;
  if ((*str == '/') && (str[1] == '/')) {
    pcStack_20 = str + 2;
    iVar2 = xmlParse3986Authority(uri,&stack0xffffffffffffffe0);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = xmlParse3986PathAbEmpty((xmlURIPtr)str_local,&stack0xffffffffffffffe0);
  }
  else {
    pcStack_20 = str;
    if (*str == '/') {
      iVar2 = xmlParse3986PathAbsolute(uri,&stack0xffffffffffffffe0);
    }
    else {
      iVar2 = xmlIsUnreserved(uri,str);
      if ((iVar2 == 0) &&
         ((((*pcStack_20 != '%' ||
            ((((pcStack_20[1] < '0' || ('9' < pcStack_20[1])) &&
              ((pcStack_20[1] < 'a' || ('f' < pcStack_20[1])))) &&
             ((pcStack_20[1] < 'A' || ('F' < pcStack_20[1])))))) ||
           (((pcStack_20[2] < '0' || ('9' < pcStack_20[2])) &&
            (((pcStack_20[2] < 'a' || ('f' < pcStack_20[2])) &&
             ((pcStack_20[2] < 'A' || ('F' < pcStack_20[2])))))))) &&
          ((((*pcStack_20 != '!' && (*pcStack_20 != '$')) && (*pcStack_20 != '&')) &&
           ((((*pcStack_20 != '(' && (*pcStack_20 != ')')) &&
             ((*pcStack_20 != '*' &&
              (((*pcStack_20 != '+' && (*pcStack_20 != ',')) &&
               ((*pcStack_20 != ';' &&
                (((*pcStack_20 != '=' && (*pcStack_20 != '\'')) && (*pcStack_20 != ':')))))))))) &&
            (*pcStack_20 != '@')))))))) {
        if (str_local != (char *)0x0) {
          if (*(long *)(str_local + 0x30) != 0) {
            (*xmlFree)(*(void **)(str_local + 0x30));
          }
          str_local[0x30] = '\0';
          str_local[0x31] = '\0';
          str_local[0x32] = '\0';
          str_local[0x33] = '\0';
          str_local[0x34] = '\0';
          str_local[0x35] = '\0';
          str_local[0x36] = '\0';
          str_local[0x37] = '\0';
        }
        goto LAB_0017207b;
      }
      iVar2 = xmlParse3986PathNoScheme((xmlURIPtr)str_local,&stack0xffffffffffffffe0);
    }
  }
  if (iVar2 != 0) {
    return iVar2;
  }
LAB_0017207b:
  if (*pcStack_20 == '?') {
    pcStack_20 = pcStack_20 + 1;
    iVar2 = xmlParse3986Query((xmlURIPtr)str_local,&stack0xffffffffffffffe0);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  if (*pcStack_20 == '#') {
    pcStack_20 = pcStack_20 + 1;
    iVar2 = xmlParse3986Fragment((xmlURIPtr)str_local,&stack0xffffffffffffffe0);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  cVar1 = *pcStack_20;
  if (cVar1 != '\0') {
    xmlCleanURI((xmlURIPtr)str_local);
  }
  uri_local._4_4_ = (uint)(cVar1 != '\0');
  return uri_local._4_4_;
}

Assistant:

static int
xmlParse3986RelativeRef(xmlURIPtr uri, const char *str) {
    int ret;

    if ((*str == '/') && (*(str + 1) == '/')) {
        str += 2;
	ret = xmlParse3986Authority(uri, &str);
	if (ret != 0) return(ret);
	ret = xmlParse3986PathAbEmpty(uri, &str);
	if (ret != 0) return(ret);
    } else if (*str == '/') {
	ret = xmlParse3986PathAbsolute(uri, &str);
	if (ret != 0) return(ret);
    } else if (ISA_PCHAR(uri, str)) {
        ret = xmlParse3986PathNoScheme(uri, &str);
	if (ret != 0) return(ret);
    } else {
	/* path-empty is effectively empty */
	if (uri != NULL) {
	    if (uri->path != NULL) xmlFree(uri->path);
	    uri->path = NULL;
	}
    }

    if (*str == '?') {
	str++;
	ret = xmlParse3986Query(uri, &str);
	if (ret != 0) return(ret);
    }
    if (*str == '#') {
	str++;
	ret = xmlParse3986Fragment(uri, &str);
	if (ret != 0) return(ret);
    }
    if (*str != 0) {
	xmlCleanURI(uri);
	return(1);
    }
    return(0);
}